

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *this_01;
  bool bVar1;
  reference __rhs;
  char *pcVar2;
  long lVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  undefined1 *puVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  int iVar9;
  int iVar10;
  bool bVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Base_ptr local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  undefined1 local_80 [8];
  string a;
  string c;
  
  if (_argc < 1) {
    iVar10 = 1;
  }
  else {
    this_00 = &this->flags_;
    local_b0 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = &this->data_;
    c.field_2._8_8_ = &this->error_;
    bVar11 = false;
    local_88 = _argv;
    for (iVar10 = 0; iVar10 < _argc; iVar10 = iVar10 + 1) {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(local_88,(long)iVar10);
      if (bVar11) {
LAB_00106ddc:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->positional_vec_,__rhs);
      }
      else {
        uVar12 = __rhs->_M_string_length;
        if (uVar12 < 2) goto LAB_00106da7;
        pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs);
        iVar9 = iVar10;
        if ((*pcVar2 != '-') ||
           (pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar2 == '-')) {
          uVar12 = __rhs->_M_string_length;
          if (2 < uVar12) {
            pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs);
            if ((*pcVar2 == '-') &&
               (pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar2 == '-')) {
              std::__cxx11::string::substr((ulong)(a.field_2._M_local_buf + 8),(ulong)__rhs);
              local_80 = (undefined1  [8])&a._M_string_length;
              a._M_dataplus._M_p = (pointer)0x0;
              a._M_string_length._0_1_ = 0;
              lVar3 = std::__cxx11::string::find(a.field_2._M_local_buf + 8,0x109535);
              if (lVar3 != -1) {
                std::__cxx11::string::substr((ulong)&local_a8,(ulong)__rhs);
                std::__cxx11::string::operator=
                          ((string *)(a.field_2._M_local_buf + 8),(string *)&local_a8);
                std::__cxx11::string::~string((string *)&local_a8);
                std::__cxx11::string::substr((ulong)&local_a8,(ulong)__rhs);
                std::__cxx11::string::operator=((string *)local_80,(string *)&local_a8);
                std::__cxx11::string::~string((string *)&local_a8);
              }
              iVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                      ::find(&this_01->_M_t,(key_type *)((long)&a.field_2 + 8));
              if ((_Rb_tree_header *)iVar4._M_node ==
                  &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
                std::operator+(&local_d0,"invalid option \'",__rhs);
                std::operator+(&local_a8,&local_d0,"\'");
LAB_001070e9:
                std::__cxx11::string::operator=((string *)c.field_2._8_8_,(string *)&local_a8);
                std::__cxx11::string::~string((string *)&local_a8);
                std::__cxx11::string::~string((string *)&local_d0);
                bVar11 = false;
                iVar9 = iVar10;
              }
              else {
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                if (pmVar5->seen_ == true) {
                  std::operator+(&local_d0,"option \'--",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&a.field_2 + 8));
                  std::operator+(&local_a8,&local_d0,"\' has already been seen");
                  goto LAB_001070e9;
                }
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                if (pmVar5->mode_ == true) {
                  if (a._M_dataplus._M_p != (pointer)0x0) goto LAB_001071cf;
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::assign((char *)&pmVar5->value_);
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,(key_type *)((long)&a.field_2 + 8));
LAB_001071f7:
                  pmVar5->seen_ = true;
                  bVar11 = true;
                }
                else {
                  if (a._M_dataplus._M_p != (pointer)0x0) {
LAB_001071cf:
                    pmVar5 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                    std::__cxx11::string::_M_assign((string *)&pmVar5->value_);
                    pmVar5 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                             ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                    goto LAB_001071f7;
                  }
                  iVar9 = iVar10 + 1;
                  if (_argc <= iVar9) {
                    std::operator+(&local_d0,"option \'--",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&a.field_2 + 8));
                    std::operator+(&local_a8,&local_d0,"\' requires an arg");
                    goto LAB_001070e9;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(local_88,(long)iVar9);
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::_M_assign((string *)&pmVar5->value_);
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_01,(key_type *)((long)&a.field_2 + 8));
                  pmVar5->seen_ = true;
                  bVar11 = true;
                }
              }
              std::__cxx11::string::~string((string *)local_80);
              goto LAB_001072ca;
            }
            uVar12 = __rhs->_M_string_length;
          }
LAB_00106da7:
          if ((uVar12 == 0) || (this->is_positional_ != true)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,"no match for \'",__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&a.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,"\'");
            std::__cxx11::string::operator=
                      ((string *)c.field_2._8_8_,(string *)(a.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(a.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_80);
            return -1;
          }
          bVar1 = std::operator==(__rhs,"--");
          if (!bVar1) goto LAB_00106ddc;
          bVar11 = true;
          goto LAB_00106deb;
        }
        puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)__rhs);
        c._M_string_length._0_1_ = *puVar6;
        a.field_2._8_8_ = &c._M_string_length;
        c._M_dataplus._M_p = (pointer)0x1;
        c._M_string_length._1_1_ = 0;
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this_00->_M_t,(key_type *)((long)&a.field_2 + 8));
        if (iVar7._M_node == local_b0) {
LAB_00106e4d:
          for (uVar12 = 1; uVar12 < __rhs->_M_string_length; uVar12 = uVar12 + 1) {
            puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)__rhs);
            a._M_string_length._0_1_ = *puVar6;
            local_80 = (undefined1  [8])&a._M_string_length;
            a._M_dataplus._M_p = (pointer)0x1;
            a._M_string_length._1_1_ = 0;
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&this_00->_M_t,(key_type *)local_80);
            if (iVar7._M_node == local_b0) {
LAB_00106f2d:
              std::operator+(&local_d0,"invalid flag \'",__rhs);
              std::operator+(&local_a8,&local_d0,"\'");
LAB_00106fed:
              std::__cxx11::string::operator=((string *)c.field_2._8_8_,(string *)&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
              std::__cxx11::string::~string((string *)&local_d0);
              this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80;
              goto LAB_00107256;
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,(key_type *)local_80);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            if (pmVar5->mode_ != true) goto LAB_00106f2d;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,(key_type *)local_80);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            if (pmVar5->seen_ == true) {
              std::operator+(&local_d0,"flag \'-",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80);
              std::operator+(&local_a8,&local_d0,"\' has already been seen");
              goto LAB_00106fed;
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,(key_type *)local_80);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            std::__cxx11::string::assign((char *)&pmVar5->value_);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(this_00,(key_type *)local_80);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_01,pmVar8);
            pmVar5->seen_ = true;
            std::__cxx11::string::~string((string *)local_80);
          }
LAB_001072c4:
          bVar11 = true;
        }
        else {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(this_00,(key_type *)((long)&a.field_2 + 8));
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                   ::at(this_01,pmVar8);
          if (pmVar5->mode_ == true) goto LAB_00106e4d;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(this_00,(key_type *)((long)&a.field_2 + 8));
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                   ::at(this_01,pmVar8);
          if (pmVar5->seen_ != true) {
            if (__rhs->_M_string_length < 3) {
LAB_00107160:
              iVar9 = iVar10 + 1;
              if (_argc <= iVar9) {
                std::operator+(&local_a8,"flag \'-",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&a.field_2 + 8));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_80,&local_a8,"\' requires an arg");
                goto LAB_0010723f;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(local_88,(long)iVar9);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::_M_assign((string *)&pmVar5->value_);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              pmVar5->seen_ = true;
              bVar11 = true;
              goto LAB_001072ca;
            }
            pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs);
            if (*pcVar2 == '=') {
              if ((__rhs->_M_string_length < 4) ||
                 (pcVar2 = (char *)std::__cxx11::string::at((ulong)__rhs), *pcVar2 != '='))
              goto LAB_00107160;
              std::__cxx11::string::substr((ulong)local_80,(ulong)__rhs);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::operator=((string *)&pmVar5->value_,(string *)local_80);
              std::__cxx11::string::~string((string *)local_80);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
            }
            else {
              std::__cxx11::string::substr((ulong)local_80,(ulong)__rhs);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
              std::__cxx11::string::operator=((string *)&pmVar5->value_,(string *)local_80);
              std::__cxx11::string::~string((string *)local_80);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(this_00,(key_type *)((long)&a.field_2 + 8));
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_01,pmVar8);
            }
            pmVar5->seen_ = true;
            goto LAB_001072c4;
          }
          std::operator+(&local_a8,"flag \'-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&a.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,&local_a8,"\' has already been seen");
LAB_0010723f:
          this_02 = &local_a8;
          std::__cxx11::string::operator=((string *)c.field_2._8_8_,(string *)local_80);
          std::__cxx11::string::~string((string *)local_80);
LAB_00107256:
          std::__cxx11::string::~string((string *)this_02);
          bVar11 = false;
          iVar9 = iVar10;
        }
LAB_001072ca:
        std::__cxx11::string::~string((string *)(a.field_2._M_local_buf + 8));
        if (!bVar11) break;
        bVar11 = false;
        iVar10 = iVar9;
      }
LAB_00106deb:
    }
    iVar10 = -(uint)(iVar10 < _argc);
  }
  return iVar10;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<std::size_t>(i))};
      // std::cerr << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        positional_vec_.emplace_back(tmp);
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cerr << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cerr << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<std::size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (std::size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cerr << "SHORT: mode -> " << s << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cerr << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cerr << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cerr << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<std::size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cerr << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          positional_vec_.emplace_back(tmp);
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        return -1;
      }
    }

    return 0;
  }